

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::localconnect(int n)

{
  uint uVar1;
  clientinfo *local_18;
  clientinfo *ci;
  int n_local;
  
  ci._4_4_ = n;
  local_18 = getinfo(n);
  privilegemsg(1,"\f7Connected from host IP");
  local_18->ownernum = ci._4_4_;
  local_18->clientnum = ci._4_4_;
  local_18->connectmillis = totalmillis;
  uVar1 = randomMT();
  local_18->sessionid = ((uVar1 & 0xffffff) % 0x1000000) * (totalmillis % 10000 + 1) & 0xffffff;
  local_18->local = true;
  vector<server::clientinfo_*>::add((vector<server::clientinfo_*> *)connects,&local_18);
  sendservinfo(local_18);
  return;
}

Assistant:

void localconnect(int n)
    {
        clientinfo *ci = getinfo(n);
        privilegemsg(PRIV_MASTER, "\f7Connected from host IP");
        ci->clientnum = ci->ownernum = n;
        ci->connectmillis = totalmillis;
        ci->sessionid = (rnd(0x1000000)*((totalmillis%10000)+1))&0xFFFFFF;
        ci->local = true;
        connects.add(ci);
        sendservinfo(ci);
    }